

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
FactoredDecPOMDPDiscrete::MarginalizeStateFactor
          (FactoredDecPOMDPDiscrete *this,Index sf,bool sparse)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  FactoredStateDistribution *fsd;
  vector<unsigned_long,_std::allocator<unsigned_long>_> old_factor_sizes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_38;
  
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
        (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                               super_MultiAgentDecisionProcess + 0xb8))();
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_38,__x);
  fsd = (FactoredStateDistribution *)
        (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                               super_MultiAgentDecisionProcess + 0xd0))(this);
  ClipRewardModel(this,sf,sparse);
  MultiAgentDecisionProcessDiscreteFactoredStates::MarginalizeTransitionObservationModel
            (&this->super_MultiAgentDecisionProcessDiscreteFactoredStates,sf,sparse);
  MarginalizeISD(this,sf,&local_38,fsd);
  if (fsd != (FactoredStateDistribution *)0x0) {
    (*(fsd->super_StateDistribution)._vptr_StateDistribution[1])(fsd);
  }
  if (local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void FactoredDecPOMDPDiscrete::MarginalizeStateFactor(Index sf, bool sparse)
{
    vector<size_t> old_factor_sizes = GetNrValuesPerFactor();
    const FactoredStateDistribution* old_isd = GetFactoredISD();

    ClipRewardModel(sf, sparse);
    MarginalizeTransitionObservationModel(sf, sparse);
    MarginalizeISD(sf, old_factor_sizes, old_isd);

    delete(old_isd);
}